

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void on_nes_video(nes_video_output *video,void *client)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  uint32_t *puVar7;
  nes_pixel *pnVar8;
  long lVar9;
  int y;
  ulong uVar10;
  ulong uVar11;
  
  pnVar8 = video->framebuffer;
  uVar1 = video->height;
  lVar9 = 0;
  for (uVar10 = 0; puVar7 = texture_buffer, uVar10 != uVar1; uVar10 = uVar10 + 1) {
    uVar2 = video->width;
    for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
      *(uint *)((long)puVar7 + uVar11 * 4 + lVar9) =
           *(uint *)(&DAT_00109150 + (ulong)pnVar8[uVar11].value * 4) | 0xff000000;
    }
    pnVar8 = pnVar8 + 0x155;
    lVar9 = lVar9 + 0x400;
  }
  SDL_UpdateTexture(texture,0,texture_buffer,0x400);
  uVar10._0_2_ = video->width;
  uVar10._2_2_ = video->height;
  uVar10._4_4_ = *(undefined4 *)&video->field_0xc;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar10;
  auVar3._12_2_ = (short)((uint)uVar10._4_4_ >> 0x10);
  auVar4._8_2_ = (short)uVar10._4_4_;
  auVar4._0_8_ = uVar10;
  auVar4._10_4_ = auVar3._10_4_;
  auVar6._6_8_ = 0;
  auVar6._0_6_ = auVar4._8_6_;
  auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
  auVar5._4_2_ = uVar10._2_2_;
  auVar5._2_2_ = 0;
  auVar5._0_2_ = (undefined2)uVar10;
  video_srcrect.w = (int)auVar5._0_8_;
  video_srcrect.h = SUB84(auVar5._0_8_,4);
  return;
}

Assistant:

void on_nes_video(const nes_video_output* video, void* client)
{
    const uint32_t colors[] = {
    0x545454, 0x741E00, 0x901008, 0x880030, 0x640044, 0x30005C, 0x000454, 0x00183C, 0x002A20, 0x003A08, 0x004000, 0x003C00, 0x3C3200, 0x000000, 0, 0,
    0x989698, 0xC44C08, 0xEC3230, 0xE41E5C, 0xB01488, 0x6414A0, 0x202298, 0x003C78, 0x005A54, 0x007228, 0x007C08, 0x287600, 0x786600, 0x000000, 0, 0,
    0xECEEEC, 0xEC9A4C, 0xEC7C78, 0xEC62B0, 0xEC54E4, 0xB458EC, 0x646AEC, 0x2088D4, 0x00AAA0, 0x00C474, 0x20D04C, 0x6CCC38, 0xCCB438, 0x3C3C3C, 0, 0, 
    0xECEEEC, 0xECCCA8, 0xECBCBC, 0xECB2D4, 0xECAEEC, 0xD4AEEC, 0xB0B4EC, 0x90C4E4, 0x78D2CC, 0x78DEB4, 0x90E2A8, 0xB4E298, 0xE4D6A0, 0xA0A2A0, 0, 0};
 
    nes_pixel* pixel = video->framebuffer;
    for (int y = 0; y < video->height; ++y)
    {
        for (int x = 0; x < video->width; ++x)
        {
            texture_buffer[y * 256 + x] = colors[(pixel + x)->value] | 0xFF000000;
        }
        pixel += NES_FRAMEBUFFER_ROW_STRIDE;
    }

    SDL_UpdateTexture(texture, 0, texture_buffer, sizeof(uint32_t) * TEXTURE_WIDTH);
    video_srcrect.w = video->width;
    video_srcrect.h = video->height;
}